

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void kratos::change_var_expr
               (shared_ptr<kratos::Expr> *expr,Var *target,Var *new_var,bool move_linked)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  VarType VVar2;
  InternalException *this_00;
  element_type *peVar3;
  element_type *this_01;
  element_type *peVar4;
  undefined1 local_d8 [24];
  Var *cond;
  shared_ptr<kratos::ConditionalExpr> ternary;
  enable_shared_from_this<kratos::Var> local_a0;
  undefined1 local_90 [8];
  shared_ptr<kratos::VarConcat> concat;
  undefined1 local_70 [40];
  string local_48;
  byte local_21;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  bool move_linked_local;
  Var *new_var_local;
  Var *target_local;
  shared_ptr<kratos::Expr> *expr_local;
  
  local_21 = move_linked;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)new_var;
  new_var_local = target;
  target_local = (Var *)expr;
  if ((new_var != (Var *)0x0) && (target != (Var *)0x0)) {
    peVar3 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)expr);
    VVar2 = Var::type(peVar3->left);
    if (VVar2 == Expression) {
      std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 target_local);
      Var::as<kratos::Expr>((Var *)local_70);
      change_var_expr((shared_ptr<kratos::Expr> *)local_70,new_var_local,(Var *)_Stack_20._M_pi,
                      (bool)(local_21 & 1));
      std::shared_ptr<kratos::Expr>::~shared_ptr((shared_ptr<kratos::Expr> *)local_70);
    }
    peVar3 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)target_local);
    if (peVar3->right != (Var *)0x0) {
      peVar3 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)target_local);
      VVar2 = Var::type(peVar3->right);
      if (VVar2 == Expression) {
        std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   target_local);
        this = &concat.super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ;
        Var::as<kratos::Expr>((Var *)this);
        change_var_expr((shared_ptr<kratos::Expr> *)this,new_var_local,(Var *)_Stack_20._M_pi,
                        (bool)(local_21 & 1));
        std::shared_ptr<kratos::Expr>::~shared_ptr
                  ((shared_ptr<kratos::Expr> *)
                   &concat.super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
    }
    peVar3 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)target_local);
    _Var1._M_pi = _Stack_20._M_pi;
    if (peVar3->left == new_var_local) {
      peVar3 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)target_local);
      peVar3->left = (Var *)_Var1._M_pi;
      if ((local_21 & 1) != 0) {
        peVar3 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)target_local);
        (*(peVar3->left->super_IRNode)._vptr_IRNode[0x14])(peVar3->left,_Stack_20._M_pi);
      }
    }
    peVar3 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)target_local);
    if ((peVar3->right != (Var *)0x0) &&
       (peVar3 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)target_local), _Var1._M_pi = _Stack_20._M_pi,
       peVar3->right == new_var_local)) {
      peVar3 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)target_local);
      peVar3->right = (Var *)_Var1._M_pi;
      if ((local_21 & 1) != 0) {
        peVar3 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)target_local);
        (*(peVar3->right->super_IRNode)._vptr_IRNode[0x14])(peVar3->right,_Stack_20._M_pi);
      }
    }
    peVar3 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)target_local);
    VVar2 = Var::type(peVar3->left);
    if (VVar2 == Slice) {
      peVar3 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)target_local);
      set_slice_var_parent(&peVar3->left,new_var_local,(Var *)_Stack_20._M_pi,false);
    }
    peVar3 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)target_local);
    if (peVar3->right != (Var *)0x0) {
      peVar3 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)target_local);
      VVar2 = Var::type(peVar3->right);
      if (VVar2 == Slice) {
        peVar3 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)target_local);
        set_slice_var_parent(&peVar3->right,new_var_local,(Var *)_Stack_20._M_pi,false);
      }
    }
    peVar3 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)target_local);
    if (peVar3->op == Concat) {
      std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 target_local);
      Var::as<kratos::VarConcat>((Var *)local_90);
      this_01 = std::
                __shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_90);
      std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_a0);
      std::enable_shared_from_this<kratos::Var>::shared_from_this
                ((enable_shared_from_this<kratos::Var> *)
                 &ternary.super___shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      VarConcat::replace_var
                (this_01,(shared_ptr<kratos::Var> *)&local_a0,
                 (shared_ptr<kratos::Var> *)
                 &ternary.super___shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::shared_ptr<kratos::Var>::~shared_ptr
                ((shared_ptr<kratos::Var> *)
                 &ternary.super___shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_a0);
      std::shared_ptr<kratos::VarConcat>::~shared_ptr((shared_ptr<kratos::VarConcat> *)local_90);
    }
    peVar3 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)target_local);
    if (peVar3->op == Conditional) {
      std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 target_local);
      Var::as<kratos::ConditionalExpr>((Var *)&cond);
      peVar4 = std::
               __shared_ptr_access<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&cond);
      local_d8._16_8_ = peVar4->condition;
      VVar2 = Var::type((Var *)local_d8._16_8_);
      _Var1._M_pi = _Stack_20._M_pi;
      if (VVar2 == Expression) {
        Var::as<kratos::Expr>((Var *)local_d8);
        change_var_expr((shared_ptr<kratos::Expr> *)local_d8,new_var_local,(Var *)_Stack_20._M_pi,
                        true);
        std::shared_ptr<kratos::Expr>::~shared_ptr((shared_ptr<kratos::Expr> *)local_d8);
      }
      else if ((Var *)local_d8._16_8_ == new_var_local) {
        peVar4 = std::
                 __shared_ptr_access<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&cond);
        peVar4->condition = (Var *)_Var1._M_pi;
      }
      else {
        VVar2 = Var::type((Var *)local_d8._16_8_);
        if (VVar2 == Slice) {
          set_slice_var_parent((Var **)(local_d8 + 0x10),new_var_local,(Var *)_Stack_20._M_pi,false)
          ;
        }
      }
      std::shared_ptr<kratos::ConditionalExpr>::~shared_ptr
                ((shared_ptr<kratos::ConditionalExpr> *)&cond);
    }
    peVar3 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)target_local);
    Expr::set_parent(peVar3);
    return;
  }
  local_70[0x13] = 1;
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Variable is NULL",(allocator<char> *)(local_70 + 0x27));
  InternalException::InternalException(this_00,&local_48);
  local_70[0x13] = 0;
  __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

void change_var_expr(const std::shared_ptr<Expr> &expr, Var *target, Var *new_var,
                     bool move_linked = true) {
    if (!new_var || !target) throw InternalException("Variable is NULL");
    if (expr->left->type() == VarType::Expression) {
        change_var_expr(expr->left->as<Expr>(), target, new_var, move_linked);
    }
    if (expr->right && expr->right->type() == VarType::Expression) {
        change_var_expr(expr->right->as<Expr>(), target, new_var, move_linked);
    }

    if (expr->left == target) {
        expr->left = new_var;
        if (move_linked) expr->left->move_linked_to(new_var);
    }
    if (expr->right && expr->right == target) {
        expr->right = new_var;
        if (move_linked) expr->right->move_linked_to(new_var);
    }

    // need to change the parent as well
    if (expr->left->type() == VarType::Slice) {
        set_slice_var_parent(expr->left, target, new_var, false);
    }
    if (expr->right && expr->right->type() == VarType::Slice) {
        set_slice_var_parent(expr->right, target, new_var, false);
    }
    // we did some tricks on the concatenation, need to update them there
    if (expr->op == ExprOp::Concat) {
        auto concat = expr->as<VarConcat>();
        concat->replace_var(target->shared_from_this(), new_var->shared_from_this());
    }
    // need to deal with ternary op as well
    if (expr->op == ExprOp::Conditional) {
        auto ternary = expr->as<ConditionalExpr>();
        auto *cond = ternary->condition;
        if (cond->type() == VarType::Expression) {
            change_var_expr(cond->as<Expr>(), target, new_var);
        } else if (cond == target) {
            ternary->condition = new_var;
        } else if (cond->type() == VarType::Slice) {
            set_slice_var_parent(cond, target, new_var, false);
        }
    }
    expr->set_parent();
}